

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O0

Member * __thiscall soul::Structure::getMemberWithName(Structure *this,string_view memberName)

{
  size_t index;
  Member *pMVar1;
  Structure *this_local;
  string_view memberName_local;
  
  index = getMemberIndex(this,memberName);
  pMVar1 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[](&this->members,index);
  return pMVar1;
}

Assistant:

Structure::Member& Structure::getMemberWithName (std::string_view memberName)
{
    return members[getMemberIndex (memberName)];
}